

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# speed.c
# Opt level: O1

int writeasctable(fitsfile *fptr,int *status)

{
  int iVar1;
  long lVar2;
  long nelem;
  long lVar3;
  long nrows;
  float elapcpu;
  double elapse;
  char extname [11];
  char *tunit [2];
  char *tform [2];
  char *ttype [2];
  long local_90;
  float local_84;
  double local_80;
  char local_78 [16];
  char *local_68;
  char *pcStack_60;
  char *local_58;
  char *pcStack_50;
  char *local_48;
  char *pcStack_40;
  
  builtin_strncpy(local_78,"Speed_Test",0xb);
  local_48 = "first";
  pcStack_40 = "second";
  local_58 = "I6";
  pcStack_50 = "I6";
  local_68 = " ";
  pcStack_60 = " ";
  lVar2 = 400000;
  iVar1 = ffcrtb(fptr,1,400000,2,&local_48,&local_58,&local_68,local_78,status);
  if (iVar1 == 0) {
    ffgrsz(fptr,&local_90,status);
    lVar3 = 20000;
    if (local_90 < 20000) {
      lVar3 = local_90;
    }
    local_90 = lVar3;
    printf("Write %7drow x %dcol asctable %4ld rows/loop:",400000,2);
    marktime(status);
    lVar3 = 1;
    do {
      nelem = local_90;
      if (lVar2 <= local_90) {
        nelem = lVar2;
      }
      ffpclj(fptr,1,lVar3,1,nelem,sarray,status);
      ffpclj(fptr,2,lVar3,1,nelem,sarray,status);
      lVar3 = lVar3 + nelem;
      lVar2 = lVar2 - nelem;
    } while (lVar2 != 0);
    ffflus(fptr,status);
    gettime(&local_80,&local_84,status);
    printf(" %4.1fMB/%6.3fs(%3.0f) = %5.2fMB/s\n",0xc0000000,local_80,
           (double)(float)(((double)local_84 / local_80) * 100.0),
           (double)(float)(5.199999809265137 / local_80));
    return *status;
  }
  printerror(*status);
}

Assistant:

int writeasctable (fitsfile *fptr, int *status)

    /*********************************************************/
    /* Create an ASCII table extension containing 2 columns  */
    /*********************************************************/
{
    int tfields = 2;
    long nremain, ntodo, firstrow = 1, firstelem = 1;
    long nrows;
    float rate, size, elapcpu, cpufrac;
    double elapse;

    char extname[] = "Speed_Test";           /* extension name */

    /* define the name, datatype, and physical units for the columns */
    char *ttype[] = { "first", "second" };
    char *tform[] = {"I6",       "I6"   };
    char *tunit[] = { " ",      " "     };

    /* append a new empty ASCII table onto the FITS file */
    if ( fits_create_tbl( fptr, ASCII_TBL, AROWS, tfields, ttype, tform,
                tunit, extname, status) )
         printerror( *status );

    /* get table row size and optimum number of rows to write per loop */
    fits_get_rowsize(fptr, &nrows, status);
    nrows = minvalue(nrows, SHTSIZE);
    nremain = AROWS;

    printf("Write %7drow x %dcol asctable %4ld rows/loop:", AROWS, tfields,
           nrows);
    marktime(status);

    while(nremain)
    {
      ntodo = minvalue(nrows, nremain);
      ffpclj(fptr, 1, firstrow, firstelem, ntodo, sarray, status);
      ffpclj(fptr, 2, firstrow, firstelem, ntodo, sarray, status);
      firstrow += ntodo;
      nremain -= ntodo;
    }

    ffflus(fptr, status);  /* flush all buffers to disk */

    gettime(&elapse, &elapcpu, status);

    cpufrac = elapcpu / elapse * 100.;
    size = AROWS * 13. / 1000000.;
    rate = size / elapse;
    printf(" %4.1fMB/%6.3fs(%3.0f) = %5.2fMB/s\n", size, elapse, cpufrac,rate);

    return( *status );
}